

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.c
# Opt level: O0

int IoCommandWriteSortCnf(Abc_Frame_t *pAbc,int argc,char **argv)

{
  int iVar1;
  uint local_3c;
  uint local_38;
  int nQueens;
  int nVars;
  int c;
  char *pFileName;
  char **argv_local;
  int argc_local;
  Abc_Frame_t *pAbc_local;
  
  local_38 = 0x10;
  local_3c = 4;
  Extra_UtilGetoptReset();
  do {
    while( true ) {
      iVar1 = Extra_UtilGetopt(argc,argv,"NQh");
      if (iVar1 == -1) {
        if (argc == globalUtilOptind + 1) {
          Abc_NtkWriteSorterCnf(argv[globalUtilOptind],local_38,local_3c);
          return 0;
        }
        goto LAB_003a0cb9;
      }
      if (iVar1 == 0x4e) break;
      if (iVar1 != 0x51) goto LAB_003a0cb9;
      if (argc <= globalUtilOptind) {
        fprintf(_stdout,"Command line switch \"-Q\" should be followed by an integer.\n");
        goto LAB_003a0cb9;
      }
      local_3c = atoi(argv[globalUtilOptind]);
      globalUtilOptind = globalUtilOptind + 1;
      if ((int)local_3c < 1) goto LAB_003a0cb9;
    }
    if (argc <= globalUtilOptind) {
      fprintf(_stdout,"Command line switch \"-N\" should be followed by an integer.\n");
      break;
    }
    local_38 = atoi(argv[globalUtilOptind]);
    globalUtilOptind = globalUtilOptind + 1;
  } while (0 < (int)local_38);
LAB_003a0cb9:
  fprintf((FILE *)pAbc->Err,"usage: write_sorter_cnf [-N <num>] [-Q <num>] <file>\n");
  fprintf((FILE *)pAbc->Err,"\t         writes CNF for the sorter\n");
  fprintf((FILE *)pAbc->Err,"\t-N num : the number of sorter bits [default = %d]\n",(ulong)local_38)
  ;
  fprintf((FILE *)pAbc->Err,"\t-Q num : the number of bits to be asserted to 1 [default = %d]\n",
          (ulong)local_3c);
  fprintf((FILE *)pAbc->Err,"\t-h     : print the help massage\n");
  fprintf((FILE *)pAbc->Err,"\tfile   : the name of the file to write\n");
  return 1;
}

Assistant:

int IoCommandWriteSortCnf( Abc_Frame_t * pAbc, int argc, char **argv )
{
    char * pFileName;
    int c;
    int nVars = 16;
    int nQueens = 4;
    extern void Abc_NtkWriteSorterCnf( char * pFileName, int nVars, int nQueens );

    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "NQh" ) ) != EOF )
    {
        switch ( c )
        {
            case 'N':
                if ( globalUtilOptind >= argc )
                {
                    fprintf( stdout, "Command line switch \"-N\" should be followed by an integer.\n" );
                    goto usage;
                }
                nVars = atoi(argv[globalUtilOptind]);
                globalUtilOptind++;
                if ( nVars <= 0 ) 
                    goto usage;
                break;
            case 'Q':
                if ( globalUtilOptind >= argc )
                {
                    fprintf( stdout, "Command line switch \"-Q\" should be followed by an integer.\n" );
                    goto usage;
                }
                nQueens = atoi(argv[globalUtilOptind]);
                globalUtilOptind++;
                if ( nQueens <= 0 ) 
                    goto usage;
                break;
            case 'h':
                goto usage;
            default:
                goto usage;
        }
    }
    if ( argc != globalUtilOptind + 1 )
        goto usage;
    // get the output file name
    pFileName = argv[globalUtilOptind];
    Abc_NtkWriteSorterCnf( pFileName, nVars, nQueens );
    // call the corresponding file writer
    return 0;

usage:
    fprintf( pAbc->Err, "usage: write_sorter_cnf [-N <num>] [-Q <num>] <file>\n" );
    fprintf( pAbc->Err, "\t         writes CNF for the sorter\n" );
    fprintf( pAbc->Err, "\t-N num : the number of sorter bits [default = %d]\n", nVars );
    fprintf( pAbc->Err, "\t-Q num : the number of bits to be asserted to 1 [default = %d]\n", nQueens );
    fprintf( pAbc->Err, "\t-h     : print the help massage\n" );
    fprintf( pAbc->Err, "\tfile   : the name of the file to write\n" );
    return 1;
}